

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void * sysbvm_jit_getTrampolineOrEntryPointForBytecode
                 (sysbvm_bytecodeJit_t *jit,sysbvm_functionBytecode_t *bytecode)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  sysbvm_bytecodeJit_t *local_58;
  uint8_t *trampolineExecutablePointer;
  uint8_t *trampolineWritePointer;
  size_t requiredCodeSize;
  size_t trampolineCodeSize;
  uint8_t trampolineCode [16];
  uint64_t trampolineTargetAddress;
  sysbvm_functionBytecode_t *bytecode_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if ((bytecode->jittedCode == 0) ||
     (bytecode->jittedCodeSessionToken != (jit->context->roots).sessionToken)) {
    if ((bytecode->jittedCodeTrampoline == 0) ||
       (bytecode->jittedCodeTrampolineSessionToken != (jit->context->roots).sessionToken)) {
      trampolineCode._8_8_ = sysbvm_bytecodeInterpreter_applyJitTrampolineDestination;
      trampolineCodeSize._0_1_ = 0xf3;
      trampolineCodeSize._1_1_ = 0xf;
      trampolineCodeSize._2_1_ = 0x1e;
      trampolineCodeSize._3_1_ = 0xfa;
      trampolineCodeSize._4_1_ = sysbvm_jit_x86_rex(true,false,false,false);
      trampolineCodeSize._5_1_ = 0xb8;
      trampolineCodeSize._6_1_ = (uint8_t)trampolineCode._8_8_;
      trampolineCodeSize._7_1_ = SUB81(trampolineCode._8_8_,1);
      trampolineCode[0] = SUB81(trampolineCode._8_8_,2);
      trampolineCode[1] = SUB81(trampolineCode._8_8_,3);
      trampolineCode[2] = SUB81(trampolineCode._8_8_,4);
      trampolineCode[3] = SUB81(trampolineCode._8_8_,5);
      trampolineCode[4] = SUB81(trampolineCode._8_8_,6);
      trampolineCode[5] = SUB81(trampolineCode._8_8_,7);
      trampolineCode[6] = 0xff;
      trampolineCode[7] =
           sysbvm_jit_x86_modRMRegister(SYSBVM_X86_64_CALL_SHADOW_SPACE,SYSBVM_X86_ESP);
      requiredCodeSize = 0x10;
      trampolineWritePointer = (uint8_t *)sysbvm_sizeAlignedTo(0x10,0x10);
      trampolineExecutablePointer = (uint8_t *)0x0;
      local_58 = (sysbvm_bytecodeJit_t *)0x0;
      sysbvm_chunkedAllocator_allocateWithDualMapping
                (&(jit->context->heap).codeAllocator,(size_t)trampolineWritePointer,0x10,
                 &trampolineExecutablePointer,&local_58);
      _Var1 = sysbvm_virtualMemory_lockCodePagesForWriting
                        (trampolineExecutablePointer,local_58,(size_t)trampolineWritePointer);
      if (!_Var1) {
        abort();
      }
      memset(trampolineExecutablePointer,0xcc,(size_t)trampolineWritePointer);
      memcpy(trampolineExecutablePointer,&trampolineCodeSize,requiredCodeSize);
      sysbvm_virtualMemory_unlockCodePagesForExecution
                (trampolineExecutablePointer,local_58,(size_t)trampolineWritePointer);
      sVar2 = sysbvm_tuple_systemHandle_encode(jit->context,(sysbvm_systemHandle_t)local_58);
      bytecode->jittedCodeTrampoline = sVar2;
      sVar2 = sysbvm_tuple_systemHandle_encode
                        (jit->context,(sysbvm_systemHandle_t)trampolineExecutablePointer);
      bytecode->jittedCodeTrampolineWritePointer = sVar2;
      bytecode->jittedCodeTrampolineSessionToken = (jit->context->roots).sessionToken;
      jit_local = local_58;
    }
    else {
      jit_local = (sysbvm_bytecodeJit_t *)
                  sysbvm_tuple_systemHandle_decode(bytecode->jittedCodeTrampoline);
    }
  }
  else {
    jit_local = (sysbvm_bytecodeJit_t *)sysbvm_tuple_systemHandle_decode(bytecode->jittedCode);
  }
  return jit_local;
}

Assistant:

static void *sysbvm_jit_getTrampolineOrEntryPointForBytecode(sysbvm_bytecodeJit_t *jit, sysbvm_functionBytecode_t *bytecode)
{
    // Attempt direct entry first.
    if(bytecode->jittedCode && bytecode->jittedCodeSessionToken == jit->context->roots.sessionToken)
        return (void*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCode);

    if(bytecode->jittedCodeTrampoline && bytecode->jittedCodeTrampolineSessionToken == jit->context->roots.sessionToken)
        return (void*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCodeTrampoline);

    uint64_t trampolineTargetAddress = (uint64_t)(uintptr_t)&sysbvm_bytecodeInterpreter_applyJitTrampolineDestination;

    uint8_t trampolineCode[] = {
        // Endbr64
        0xF3, 0x0F, 0x1E, 0xFA,

        // Mov64
        sysbvm_jit_x86_rex(true, false, false, false),
        0xB8 + SYSBVM_X86_RAX,
        trampolineTargetAddress & 0xFF, (trampolineTargetAddress >> 8) & 0xFF, (trampolineTargetAddress >> 16) & 0xFF, (trampolineTargetAddress >> 24) & 0xFF,
        (trampolineTargetAddress >> 32) & 0xFF, (trampolineTargetAddress >> 40) & 0xFF, (trampolineTargetAddress >> 48) & 0xFF, (trampolineTargetAddress >> 56) & 0xFF,

        // Jmp RAX
        0xFF,
        sysbvm_jit_x86_modRMRegister(SYSBVM_X86_RAX, 4),
    };

    // Install the trampoline in the code zone.
    size_t trampolineCodeSize = sizeof(trampolineCode);
    size_t requiredCodeSize = sysbvm_sizeAlignedTo(trampolineCodeSize, 16);

    uint8_t *trampolineWritePointer = NULL;
    uint8_t *trampolineExecutablePointer = NULL;
    sysbvm_chunkedAllocator_allocateWithDualMapping(&jit->context->heap.codeAllocator, requiredCodeSize, 16, (void**)&trampolineWritePointer, (void**)&trampolineExecutablePointer);
    if(!sysbvm_virtualMemory_lockCodePagesForWriting(trampolineWritePointer, trampolineExecutablePointer, requiredCodeSize))
        abort();

    memset(trampolineWritePointer, 0xcc, requiredCodeSize); // int3;
    memcpy(trampolineWritePointer, trampolineCode, trampolineCodeSize);

    sysbvm_virtualMemory_unlockCodePagesForExecution(trampolineWritePointer, trampolineExecutablePointer, requiredCodeSize);

    bytecode->jittedCodeTrampoline = sysbvm_tuple_systemHandle_encode(jit->context, (sysbvm_systemHandle_t)(uintptr_t)trampolineExecutablePointer);
    bytecode->jittedCodeTrampolineWritePointer = sysbvm_tuple_systemHandle_encode(jit->context, (sysbvm_systemHandle_t)(uintptr_t)trampolineWritePointer);
    bytecode->jittedCodeTrampolineSessionToken = jit->context->roots.sessionToken;

    return trampolineExecutablePointer;
}